

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

void Abc_NtkDumpVariableOrder(Abc_Ntk_t *pNtk)

{
  long lVar1;
  FILE *__stream;
  long lVar2;
  
  if (7 < pNtk->vAttrs->nSize) {
    lVar1 = *(long *)((long)pNtk->vAttrs->pArray[7] + 0x10);
    __stream = fopen("order.txt","wb");
    if (0 < *(int *)(lVar1 + 0x88)) {
      lVar2 = 0;
      do {
        fprintf(__stream,"%d ",(ulong)*(uint *)(*(long *)(lVar1 + 0x148) + lVar2 * 4));
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)(lVar1 + 0x88));
    }
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkDumpVariableOrder( Abc_Ntk_t * pNtk )
{
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    FILE * pFile = fopen( "order.txt", "wb" ); int i;
    for ( i = 0; i < dd->size; i++ )
        fprintf( pFile, "%d ", dd->invperm[i] );
    fprintf( pFile, "\n" );
    fclose( pFile );
}